

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-calcs.c
# Opt level: O1

wchar_t calc_unlocking_chance(player *p,wchar_t lock_power,_Bool lock_unseen)

{
  wchar_t wVar1;
  wchar_t wVar2;
  undefined3 in_register_00000011;
  
  wVar2 = (p->state).skills[0];
  if ((CONCAT31(in_register_00000011,lock_unseen) != 0) || (p->timed[2] != 0)) {
    wVar2 = wVar2 / 10;
  }
  if ((p->timed[4] != 0) || (p->timed[6] != 0)) {
    wVar2 = wVar2 / 10;
  }
  wVar2 = wVar2 + lock_power * -4;
  wVar1 = L'\x02';
  if (L'\x02' < wVar2) {
    wVar1 = wVar2;
  }
  return wVar1;
}

Assistant:

int calc_unlocking_chance(const struct player *p, int lock_power,
		bool lock_unseen)
{
	int skill = p->state.skills[SKILL_DISARM_PHYS];

	if (lock_unseen || p->timed[TMD_BLIND]) {
		skill /= 10;
	}
	if (p->timed[TMD_CONFUSED] || p->timed[TMD_IMAGE]) {
		skill /= 10;
	}

	/* Always allow some chance of unlocking. */
	return MAX(2, skill - 4 * lock_power);
}